

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O1

void __thiscall GCPtr<symbols::Object>::GCPtr(GCPtr<symbols::Object> *this,Object *t)

{
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar1;
  _List_node_base *p_Var2;
  
  if (first) {
    atexit(shutdown);
  }
  first = false;
  plVar1 = &gclist_abi_cxx11_;
  do {
    plVar1 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
             (plVar1->
             super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (plVar1 == &gclist_abi_cxx11_) goto LAB_0010d304;
  } while (*(_List_node_base **)((long)plVar1 + 0x10U + 8) != (_List_node_base *)t);
  if (plVar1 == &gclist_abi_cxx11_) {
LAB_0010d304:
    p_Var2 = (_List_node_base *)operator_new(0x20);
    *(undefined4 *)&p_Var2[1]._M_next = 1;
    p_Var2[1]._M_prev = (_List_node_base *)t;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    gclist_abi_cxx11_.
    super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>._M_impl.
    _M_node._M_size =
         gclist_abi_cxx11_.
         super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>.
         _M_impl._M_node._M_size + 1;
  }
  else {
    *(int *)((long)plVar1 + 0x10U) = *(int *)((long)plVar1 + 0x10U) + 1;
  }
  this->addr = t;
  return;
}

Assistant:

GCPtr(T *t=nullptr){

        if(first) atexit(shutdown);
        first = false;

        typename list<GCInfo<T>>::iterator p;
        p = findPtrInfo(t);

        if(p != gclist.end())
            p->refcount++;
        else{

            GCInfo<T> gcObj(t);
            gclist.push_front(gcObj);
        }
        addr = t;
        #ifdef DISPLAY
           cout << "Constructing GCPtr. " << endl;
        #endif
    }